

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

void insert<16384u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_char>,unsigned_char>
               (TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *root,uchar **strings,
               size_t n)

{
  vector_brodnik<unsigned_char_*> *pvVar1;
  bool bVar2;
  size_t sVar3;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *pTVar4;
  reference ppvVar5;
  BurstSimple<unsigned_char> local_51;
  vector_brodnik<unsigned_char_*> *local_50;
  vector_brodnik<unsigned_char_*> *bucket;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *node;
  size_t sStack_38;
  uchar c;
  size_t depth;
  uchar *str;
  size_t i;
  size_t n_local;
  uchar **strings_local;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *root_local;
  
  str = (uchar *)0x0;
  i = n;
  n_local = (size_t)strings;
  strings_local = (uchar **)root;
  do {
    if (i <= str) {
      return;
    }
    depth = *(undefined8 *)(n_local + (long)str * 8);
    sStack_38 = 0;
    node._7_1_ = get_char<unsigned_char>((uchar *)depth,0);
    bucket = (vector_brodnik<unsigned_char_*> *)strings_local;
    while (bVar2 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::is_trie
                             ((TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *)bucket,
                              (uint)node._7_1_), bVar2) {
      bVar2 = is_end<unsigned_char>(node._7_1_);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("not is_end(c)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0xeb,
                      "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_brodnik<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                     );
      }
      bucket = (vector_brodnik<unsigned_char_*> *)
               TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_node
                         ((TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *)bucket,
                          (uint)node._7_1_);
      sStack_38 = sStack_38 + 1;
      node._7_1_ = get_char<unsigned_char>((uchar *)depth,sStack_38);
    }
    local_50 = TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_>::get_bucket
                         ((TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *)bucket,
                          (uint)node._7_1_);
    if (local_50 == (vector_brodnik<unsigned_char_*> *)0x0) {
      __assert_fail("bucket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                    ,0xf1,
                    "void insert(TrieNode<CharT, BucketT> *, unsigned char **, size_t) [Threshold = 16384U, BucketT = vector_brodnik<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                   );
    }
    vector_brodnik<unsigned_char_*>::push_back(local_50,(uchar **)&depth);
    bVar2 = is_end<unsigned_char>(node._7_1_);
    if ((!bVar2) && (sVar3 = vector_brodnik<unsigned_char_*>::size(local_50), 0x4000 < sVar3)) {
      pTVar4 = BurstSimple<unsigned_char>::operator()(&local_51,local_50,sStack_38 + 1);
      ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)bucket,(ulong)node._7_1_);
      *ppvVar5 = pTVar4;
      ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)bucket,(ulong)node._7_1_);
      make_trie(ppvVar5);
      pvVar1 = local_50;
      if (local_50 != (vector_brodnik<unsigned_char_*> *)0x0) {
        vector_brodnik<unsigned_char_*>::~vector_brodnik(local_50);
        operator_delete(pvVar1);
      }
    }
    str = str + 1;
  } while( true );
}

Assistant:

static inline void
insert(TrieNode<CharT, BucketT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT, BucketT>* node = root;
		while (node->is_trie(c)) {
			assert(not is_end(c));
			node = node->get_node(c);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = node->get_bucket(c);
		assert(bucket);
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->_buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			make_trie(node->_buckets[c]);
			delete bucket;
		}
	}
}